

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall fasttext::Model::computeOutputSigmoid(Model *this,Vector *hidden,Vector *output)

{
  real *prVar1;
  Vector *in_RDX;
  Model *in_RSI;
  Model *in_RDI;
  int32_t i;
  int64_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  real in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  
  computeOutput(in_RSI,in_RDX,
                (Vector *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar2 = 0; iVar2 < in_RDI->osz_; iVar2 = iVar2 + 1) {
    Vector::operator[]((Vector *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd4 = sigmoid(in_RDI,in_stack_ffffffffffffffd4);
    prVar1 = Vector::operator[]((Vector *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                in_stack_ffffffffffffffc8);
    *prVar1 = in_stack_ffffffffffffffd4;
  }
  return;
}

Assistant:

void Model::computeOutputSigmoid(Vector& hidden, Vector& output) const {
	computeOutput(hidden, output);
	for (int32_t i = 0; i < osz_; i++) {
		output[i] = sigmoid(output[i]);
	}
}